

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-open.c
# Opt level: O3

int run_test_udp_open(void)

{
  int iVar1;
  uint uVar2;
  int extraout_EAX;
  uint uVar3;
  int extraout_EAX_00;
  undefined8 uVar4;
  undefined1 *puVar5;
  undefined4 *in_RCX;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  ulong unaff_RBX;
  ulong uVar6;
  ulong uVar7;
  undefined1 *puVar8;
  int in_R8D;
  uv_buf_t buf;
  sockaddr_in addr;
  uv_udp_t client;
  uv_udp_t client2;
  undefined1 auStack_868 [16];
  undefined1 auStack_856 [18];
  undefined8 uStack_844;
  undefined8 uStack_83c;
  undefined8 uStack_834;
  undefined8 uStack_82c;
  undefined8 uStack_824;
  undefined8 uStack_81c;
  undefined8 uStack_814;
  undefined8 uStack_80c;
  undefined8 uStack_804;
  undefined4 uStack_7fc;
  undefined4 uStack_7f8;
  undefined4 uStack_7f4;
  undefined8 uStack_7f0;
  undefined1 auStack_7e8 [216];
  undefined1 auStack_710 [320];
  ulong uStack_5d0;
  code *pcStack_5c8;
  undefined1 auStack_5c0 [16];
  sockaddr sStack_5b0;
  undefined1 auStack_5a0 [96];
  long lStack_540;
  undefined1 auStack_4c8 [216];
  code *pcStack_3f0;
  sockaddr sStack_3e0;
  undefined1 auStack_3d0 [216];
  code *pcStack_2f8;
  undefined1 auStack_2f0 [216];
  ulong uStack_218;
  undefined4 uStack_1e4;
  code *pcStack_1e0;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [96];
  long local_158;
  undefined1 local_e0 [216];
  
  pcStack_1e0 = (code *)0x18977d;
  local_1d8 = uv_buf_init("PING",4);
  pcStack_1e0 = (code *)0x18979c;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_1c8);
  if (iVar1 == 0) {
    pcStack_1e0 = (code *)0x1897a9;
    uVar2 = create_udp_socket();
    unaff_RBX = (ulong)uVar2;
    pcStack_1e0 = (code *)0x1897b0;
    uVar4 = uv_default_loop();
    pcStack_1e0 = (code *)0x1897bd;
    iVar1 = uv_udp_init(uVar4,local_1b8);
    if (iVar1 != 0) goto LAB_001898fc;
    pcStack_1e0 = (code *)0x1897d1;
    iVar1 = uv_udp_open(local_1b8,uVar2);
    if (iVar1 != 0) goto LAB_00189901;
    pcStack_1e0 = (code *)0x1897ea;
    iVar1 = uv_udp_bind(local_1b8,local_1c8,0);
    if (iVar1 != 0) goto LAB_00189906;
    pcStack_1e0 = (code *)0x18980a;
    iVar1 = uv_udp_recv_start(local_1b8,alloc_cb,recv_cb);
    if (iVar1 != 0) goto LAB_0018990b;
    puVar8 = local_1c8;
    in_RCX = (undefined4 *)0x1;
    pcStack_1e0 = (code *)0x189837;
    iVar1 = uv_udp_send(&send_req,local_1b8,local_1d8,1,puVar8,send_cb);
    in_R8D = (int)puVar8;
    if (iVar1 != 0) goto LAB_00189910;
    pcStack_1e0 = (code *)0x189844;
    uVar4 = uv_default_loop();
    pcStack_1e0 = (code *)0x189854;
    iVar1 = uv_udp_init(uVar4,local_e0);
    if (iVar1 != 0) goto LAB_00189915;
    pcStack_1e0 = (code *)0x18986b;
    iVar1 = uv_udp_open(local_e0,uVar2);
    if (iVar1 != -0x11) goto LAB_0018991a;
    pcStack_1e0 = (code *)0x189883;
    uv_close(local_e0,0);
    pcStack_1e0 = (code *)0x189888;
    uVar4 = uv_default_loop();
    pcStack_1e0 = (code *)0x189892;
    uv_run(uVar4,0);
    if (send_cb_called != 1) goto LAB_0018991f;
    if (close_cb_called != 1) goto LAB_00189924;
    if (local_158 != 0) goto LAB_00189929;
    pcStack_1e0 = (code *)0x1898b8;
    unaff_RBX = uv_default_loop();
    pcStack_1e0 = (code *)0x1898cc;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_1e0 = (code *)0x1898d6;
    uv_run(unaff_RBX,0);
    pcStack_1e0 = (code *)0x1898db;
    uVar4 = uv_default_loop();
    pcStack_1e0 = (code *)0x1898e3;
    iVar1 = uv_loop_close(uVar4);
    if (iVar1 == 0) {
      pcStack_1e0 = (code *)0x1898ec;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_1e0 = (code *)0x1898fc;
    run_test_udp_open_cold_1();
LAB_001898fc:
    pcStack_1e0 = (code *)0x189901;
    run_test_udp_open_cold_2();
LAB_00189901:
    pcStack_1e0 = (code *)0x189906;
    run_test_udp_open_cold_3();
LAB_00189906:
    pcStack_1e0 = (code *)0x18990b;
    run_test_udp_open_cold_4();
LAB_0018990b:
    pcStack_1e0 = (code *)0x189910;
    run_test_udp_open_cold_5();
LAB_00189910:
    pcStack_1e0 = (code *)0x189915;
    run_test_udp_open_cold_6();
LAB_00189915:
    pcStack_1e0 = (code *)0x18991a;
    run_test_udp_open_cold_7();
LAB_0018991a:
    pcStack_1e0 = (code *)0x18991f;
    run_test_udp_open_cold_8();
LAB_0018991f:
    pcStack_1e0 = (code *)0x189924;
    run_test_udp_open_cold_9();
LAB_00189924:
    pcStack_1e0 = (code *)0x189929;
    run_test_udp_open_cold_10();
LAB_00189929:
    pcStack_1e0 = (code *)0x18992e;
    run_test_udp_open_cold_11();
  }
  pcStack_1e0 = create_udp_socket;
  run_test_udp_open_cold_12();
  uVar7 = 2;
  uVar6 = 2;
  pcStack_1e0 = (code *)unaff_RBX;
  uVar2 = socket(2,2,0);
  if ((int)uVar2 < 0) {
    create_udp_socket_cold_1();
  }
  else {
    unaff_RBX = (ulong)uVar2;
    in_RCX = &uStack_1e4;
    uStack_1e4 = 1;
    uVar7 = (ulong)uVar2;
    uVar6 = 1;
    in_R8D = 4;
    iVar1 = setsockopt(uVar2,1,2,in_RCX,4);
    if (iVar1 == 0) {
      return uVar2;
    }
  }
  create_udp_socket_cold_2();
  if (uVar6 < 0x10001) {
    *extraout_RDX = alloc_cb::slab;
    extraout_RDX[1] = 0x10000;
    return 0x57fd00;
  }
  alloc_cb_cold_1();
  if ((long)uVar6 < 0) {
    recv_cb_cold_7();
LAB_001899f4:
    recv_cb_cold_1();
LAB_001899f9:
    recv_cb_cold_5();
LAB_001899fe:
    recv_cb_cold_2();
LAB_00189a03:
    recv_cb_cold_3();
LAB_00189a08:
    recv_cb_cold_4();
  }
  else {
    if (uVar6 != 0) {
      if (in_R8D != 0) goto LAB_001899f4;
      if (in_RCX == (undefined4 *)0x0) goto LAB_001899f9;
      if (uVar6 != 4) goto LAB_001899fe;
      if (*(int *)*extraout_RDX_00 != 0x474e4950) goto LAB_00189a03;
      iVar1 = uv_udp_recv_stop();
      unaff_RBX = uVar7;
      if (iVar1 == 0) {
        iVar1 = uv_close(uVar7,close_cb);
        return iVar1;
      }
      goto LAB_00189a08;
    }
    if (in_RCX == (undefined4 *)0x0) {
      return extraout_EAX;
    }
  }
  iVar1 = (int)uVar6;
  recv_cb_cold_6();
  if (in_RCX == (undefined4 *)0x0) {
    send_cb_cold_2();
  }
  else if (iVar1 == 0) {
    send_cb_called = send_cb_called + 1;
    iVar1 = uv_close(*(undefined8 *)(in_RCX + 0x10),close_cb);
    return iVar1;
  }
  send_cb_cold_1();
  pcStack_2f8 = (code *)0x189a4e;
  uStack_218 = unaff_RBX;
  uVar2 = create_udp_socket();
  pcStack_2f8 = (code *)0x189a55;
  uVar3 = create_udp_socket();
  uVar6 = (ulong)uVar3;
  pcStack_2f8 = (code *)0x189a5c;
  uVar4 = uv_default_loop();
  pcStack_2f8 = (code *)0x189a67;
  iVar1 = uv_udp_init(uVar4,auStack_2f0);
  if (iVar1 == 0) {
    pcStack_2f8 = (code *)0x189a79;
    iVar1 = uv_udp_open(auStack_2f0,uVar2);
    if (iVar1 != 0) goto LAB_00189afa;
    pcStack_2f8 = (code *)0x189a87;
    iVar1 = uv_udp_open(auStack_2f0,uVar3);
    if (iVar1 != -0x10) goto LAB_00189aff;
    pcStack_2f8 = (code *)0x189a93;
    iVar1 = close(uVar3);
    if (iVar1 != 0) goto LAB_00189b04;
    pcStack_2f8 = (code *)0x189aa1;
    uv_close(auStack_2f0,0);
    pcStack_2f8 = (code *)0x189aa6;
    uVar4 = uv_default_loop();
    pcStack_2f8 = (code *)0x189ab0;
    uv_run(uVar4,0);
    pcStack_2f8 = (code *)0x189ab5;
    uVar6 = uv_default_loop();
    pcStack_2f8 = (code *)0x189ac9;
    uv_walk(uVar6,close_walk_cb,0);
    pcStack_2f8 = (code *)0x189ad3;
    uv_run(uVar6,0);
    pcStack_2f8 = (code *)0x189ad8;
    uVar4 = uv_default_loop();
    pcStack_2f8 = (code *)0x189ae0;
    iVar1 = uv_loop_close(uVar4);
    if (iVar1 == 0) {
      pcStack_2f8 = (code *)0x189ae9;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_2f8 = (code *)0x189afa;
    run_test_udp_open_twice_cold_1();
LAB_00189afa:
    pcStack_2f8 = (code *)0x189aff;
    run_test_udp_open_twice_cold_2();
LAB_00189aff:
    pcStack_2f8 = (code *)0x189b04;
    run_test_udp_open_twice_cold_3();
LAB_00189b04:
    pcStack_2f8 = (code *)0x189b09;
    run_test_udp_open_twice_cold_4();
  }
  pcStack_2f8 = run_test_udp_open_bound;
  run_test_udp_open_twice_cold_5();
  pcStack_3f0 = (code *)0x189b2c;
  pcStack_2f8 = (code *)uVar6;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_3e0);
  if (iVar1 == 0) {
    pcStack_3f0 = (code *)0x189b39;
    uVar3 = create_udp_socket();
    uVar6 = (ulong)uVar3;
    pcStack_3f0 = (code *)0x189b4c;
    iVar1 = bind(uVar3,&sStack_3e0,0x10);
    if (iVar1 != 0) goto LAB_00189c02;
    pcStack_3f0 = (code *)0x189b59;
    uVar4 = uv_default_loop();
    pcStack_3f0 = (code *)0x189b66;
    iVar1 = uv_udp_init(uVar4,auStack_3d0);
    if (iVar1 != 0) goto LAB_00189c07;
    pcStack_3f0 = (code *)0x189b7a;
    iVar1 = uv_udp_open(auStack_3d0,uVar3);
    if (iVar1 != 0) goto LAB_00189c0c;
    pcStack_3f0 = (code *)0x189b9a;
    iVar1 = uv_udp_recv_start(auStack_3d0,alloc_cb,recv_cb);
    if (iVar1 != 0) goto LAB_00189c11;
    pcStack_3f0 = (code *)0x189baa;
    uv_close(auStack_3d0,0);
    pcStack_3f0 = (code *)0x189baf;
    uVar4 = uv_default_loop();
    pcStack_3f0 = (code *)0x189bb9;
    uv_run(uVar4,0);
    pcStack_3f0 = (code *)0x189bbe;
    uVar6 = uv_default_loop();
    pcStack_3f0 = (code *)0x189bd2;
    uv_walk(uVar6,close_walk_cb,0);
    pcStack_3f0 = (code *)0x189bdc;
    uv_run(uVar6,0);
    pcStack_3f0 = (code *)0x189be1;
    uVar4 = uv_default_loop();
    pcStack_3f0 = (code *)0x189be9;
    iVar1 = uv_loop_close(uVar4);
    if (iVar1 == 0) {
      pcStack_3f0 = (code *)0x189bf2;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_3f0 = (code *)0x189c02;
    run_test_udp_open_bound_cold_1();
LAB_00189c02:
    pcStack_3f0 = (code *)0x189c07;
    run_test_udp_open_bound_cold_2();
LAB_00189c07:
    pcStack_3f0 = (code *)0x189c0c;
    run_test_udp_open_bound_cold_3();
LAB_00189c0c:
    pcStack_3f0 = (code *)0x189c11;
    run_test_udp_open_bound_cold_4();
LAB_00189c11:
    pcStack_3f0 = (code *)0x189c16;
    run_test_udp_open_bound_cold_5();
  }
  pcStack_3f0 = run_test_udp_open_connect;
  run_test_udp_open_bound_cold_6();
  pcStack_5c8 = (code *)0x189c34;
  pcStack_3f0 = (code *)uVar6;
  auStack_5c0 = uv_buf_init("PING",4);
  pcStack_5c8 = (code *)0x189c53;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_5b0);
  if (iVar1 == 0) {
    pcStack_5c8 = (code *)0x189c60;
    uVar3 = create_udp_socket();
    uVar6 = (ulong)uVar3;
    pcStack_5c8 = (code *)0x189c67;
    uVar4 = uv_default_loop();
    pcStack_5c8 = (code *)0x189c74;
    iVar1 = uv_udp_init(uVar4,auStack_5a0);
    if (iVar1 != 0) goto LAB_00189da9;
    pcStack_5c8 = (code *)0x189c8d;
    iVar1 = connect(uVar3,&sStack_5b0,0x10);
    if (iVar1 != 0) goto LAB_00189dae;
    pcStack_5c8 = (code *)0x189ca1;
    iVar1 = uv_udp_open(auStack_5a0,uVar3);
    if (iVar1 != 0) goto LAB_00189db3;
    pcStack_5c8 = (code *)0x189cae;
    uVar4 = uv_default_loop();
    pcStack_5c8 = (code *)0x189cbe;
    iVar1 = uv_udp_init(uVar4,auStack_4c8);
    if (iVar1 != 0) goto LAB_00189db8;
    pcStack_5c8 = (code *)0x189cda;
    iVar1 = uv_udp_bind(auStack_4c8,&sStack_5b0,0);
    if (iVar1 != 0) goto LAB_00189dbd;
    pcStack_5c8 = (code *)0x189cfd;
    iVar1 = uv_udp_recv_start(auStack_4c8,alloc_cb,recv_cb);
    if (iVar1 != 0) goto LAB_00189dc2;
    pcStack_5c8 = (code *)0x189d28;
    iVar1 = uv_udp_send(&send_req,auStack_5a0,auStack_5c0,1,0,send_cb);
    if (iVar1 != 0) goto LAB_00189dc7;
    pcStack_5c8 = (code *)0x189d35;
    uVar4 = uv_default_loop();
    pcStack_5c8 = (code *)0x189d3f;
    uv_run(uVar4,0);
    if (send_cb_called != 1) goto LAB_00189dcc;
    if (close_cb_called != 2) goto LAB_00189dd1;
    if (lStack_540 != 0) goto LAB_00189dd6;
    pcStack_5c8 = (code *)0x189d65;
    uVar6 = uv_default_loop();
    pcStack_5c8 = (code *)0x189d79;
    uv_walk(uVar6,close_walk_cb,0);
    pcStack_5c8 = (code *)0x189d83;
    uv_run(uVar6,0);
    pcStack_5c8 = (code *)0x189d88;
    uVar4 = uv_default_loop();
    pcStack_5c8 = (code *)0x189d90;
    iVar1 = uv_loop_close(uVar4);
    if (iVar1 == 0) {
      pcStack_5c8 = (code *)0x189d99;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_5c8 = (code *)0x189da9;
    run_test_udp_open_connect_cold_1();
LAB_00189da9:
    pcStack_5c8 = (code *)0x189dae;
    run_test_udp_open_connect_cold_2();
LAB_00189dae:
    pcStack_5c8 = (code *)0x189db3;
    run_test_udp_open_connect_cold_3();
LAB_00189db3:
    pcStack_5c8 = (code *)0x189db8;
    run_test_udp_open_connect_cold_4();
LAB_00189db8:
    pcStack_5c8 = (code *)0x189dbd;
    run_test_udp_open_connect_cold_5();
LAB_00189dbd:
    pcStack_5c8 = (code *)0x189dc2;
    run_test_udp_open_connect_cold_6();
LAB_00189dc2:
    pcStack_5c8 = (code *)0x189dc7;
    run_test_udp_open_connect_cold_7();
LAB_00189dc7:
    pcStack_5c8 = (code *)0x189dcc;
    run_test_udp_open_connect_cold_8();
LAB_00189dcc:
    pcStack_5c8 = (code *)0x189dd1;
    run_test_udp_open_connect_cold_9();
LAB_00189dd1:
    pcStack_5c8 = (code *)0x189dd6;
    run_test_udp_open_connect_cold_10();
LAB_00189dd6:
    pcStack_5c8 = (code *)0x189ddb;
    run_test_udp_open_connect_cold_11();
  }
  pcStack_5c8 = run_test_udp_send_unix;
  run_test_udp_open_connect_cold_12();
  uStack_5d0 = uVar6;
  pcStack_5c8 = (code *)(ulong)uVar2;
  auStack_868 = uv_buf_init("PING",4);
  puVar5 = (undefined1 *)uv_default_loop();
  uStack_83c = 0;
  uStack_834 = 0;
  uStack_82c = 0;
  uStack_824 = 0;
  uStack_81c = 0;
  uStack_814 = 0;
  uStack_80c = 0;
  uStack_804 = 0;
  uStack_7fc = 0;
  uStack_7f8 = 0;
  uStack_7f4 = 0;
  uStack_7f0 = 0;
  auStack_856._0_2_ = 1;
  auStack_856[2] = '/';
  auStack_856[3] = 't';
  auStack_856[4] = 'm';
  auStack_856[5] = 'p';
  auStack_856[6] = '/';
  auStack_856[7] = 'u';
  auStack_856[8] = 'v';
  auStack_856[9] = '-';
  auStack_856[10] = 't';
  auStack_856[0xb] = 'e';
  auStack_856[0xc] = 's';
  auStack_856[0xd] = 't';
  auStack_856[0xe] = '-';
  auStack_856[0xf] = 's';
  auStack_856[0x10] = 'o';
  auStack_856[0x11] = 'c';
  uStack_844 = 0x6b;
  puVar8 = (undefined1 *)0x1;
  uVar2 = socket(1,1,0);
  if ((int)uVar2 < 0) {
    run_test_udp_send_unix_cold_1();
LAB_00189f74:
    run_test_udp_send_unix_cold_2();
LAB_00189f79:
    run_test_udp_send_unix_cold_3();
LAB_00189f7e:
    run_test_udp_send_unix_cold_4();
LAB_00189f83:
    run_test_udp_send_unix_cold_5();
  }
  else {
    unlink("/tmp/uv-test-sock");
    puVar8 = (undefined1 *)(ulong)uVar2;
    iVar1 = bind(uVar2,(sockaddr *)auStack_856,0x6e);
    if (iVar1 != 0) goto LAB_00189f74;
    puVar8 = (undefined1 *)(ulong)uVar2;
    iVar1 = listen(uVar2,1);
    if (iVar1 != 0) goto LAB_00189f79;
    puVar8 = puVar5;
    iVar1 = uv_udp_init(puVar5,auStack_7e8);
    if (iVar1 != 0) goto LAB_00189f7e;
    puVar8 = auStack_7e8;
    iVar1 = uv_udp_open(puVar8,uVar2);
    if (iVar1 != 0) goto LAB_00189f83;
    uv_run(puVar5,0);
    puVar8 = auStack_710;
    iVar1 = uv_udp_send(puVar8,auStack_7e8,auStack_868,1,auStack_856,0);
    if (iVar1 == 0) {
      uv_close(auStack_7e8,0);
      uv_run(puVar5,0);
      close(uVar2);
      unlink("/tmp/uv-test-sock");
      uVar4 = uv_default_loop();
      uv_walk(uVar4,close_walk_cb,0);
      uv_run(uVar4,0);
      puVar8 = (undefined1 *)uv_default_loop();
      iVar1 = uv_loop_close();
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_00189f8d;
    }
  }
  run_test_udp_send_unix_cold_6();
LAB_00189f8d:
  run_test_udp_send_unix_cold_7();
  if (puVar8 != (undefined1 *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX_00;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(puVar8,0);
  return iVar1;
}

Assistant:

TEST_IMPL(udp_open) {
  struct sockaddr_in addr;
  uv_buf_t buf = uv_buf_init("PING", 4);
  uv_udp_t client, client2;
  uv_os_sock_t sock;
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  startup();
  sock = create_udp_socket();

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  r = uv_udp_open(&client, sock);
  ASSERT(r == 0);

  r = uv_udp_bind(&client, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_udp_recv_start(&client, alloc_cb, recv_cb);
  ASSERT(r == 0);

  r = uv_udp_send(&send_req,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT(r == 0);

#ifndef _WIN32
  {
    r = uv_udp_init(uv_default_loop(), &client2);
    ASSERT(r == 0);

    r = uv_udp_open(&client2, sock);
    ASSERT(r == UV_EEXIST);

    uv_close((uv_handle_t*) &client2, NULL);
  }
#else  /* _WIN32 */
  (void)client2;
#endif

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(send_cb_called == 1);
  ASSERT(close_cb_called == 1);

  ASSERT(client.send_queue_size == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}